

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

int fio_base64_encode(char *target,char *data,int len)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  
  lVar11 = (long)len;
  iVar6 = len / 3;
  iVar12 = len % 3;
  iVar5 = (iVar6 + 1) - (uint)(iVar12 == 0);
  pcVar10 = target + (long)iVar5 * 4;
  *pcVar10 = '\0';
  if (iVar12 == 1) {
    uVar7 = (uint)data[lVar11 + -1];
    lVar11 = lVar11 + -2;
    pcVar10[-2] = '=';
    pcVar10[-1] = '=';
    uVar8 = (uVar7 & 3) << 4;
  }
  else {
    if (iVar12 != 2) {
      pcVar10 = target + (long)iVar5 * 4 + -1;
      lVar11 = lVar11 + -1;
      goto LAB_00115c01;
    }
    cVar1 = data[lVar11 + -1];
    uVar7 = (uint)data[lVar11 + -2];
    lVar11 = lVar11 + -3;
    pcVar10[-1] = '=';
    pcVar10[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                  [(ulong)((int)cVar1 & 0xf) * 4];
    uVar8 = (uint)(int)cVar1 >> 4 & 0xf | (uVar7 & 3) << 4;
  }
  pcVar10[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[uVar8];
  pcVar10[-4] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                [uVar7 >> 2 & 0x3f];
  pcVar10 = pcVar10 + -5;
LAB_00115c01:
  pbVar9 = (byte *)(data + lVar11);
  if (4 < len + 2U) {
    do {
      bVar2 = *pbVar9;
      bVar3 = pbVar9[-1];
      bVar4 = pbVar9[-2];
      *pcVar10 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="[bVar2 & 0x3f];
      pcVar10[-1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                    [(uint)(bVar2 >> 6) + ((int)(char)bVar3 & 0xfU) * 4];
      pcVar10[-2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                    [(uint)(int)(char)bVar3 >> 4 & 0xf | ((int)(char)bVar4 & 3U) << 4];
      pcVar10[-3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/="
                    [(uint)(int)(char)bVar4 >> 2 & 0x3f];
      pcVar10 = pcVar10 + -4;
      pbVar9 = pbVar9 + -3;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
  }
  return iVar5 * 4;
}

Assistant:

static inline int fio_base64_encode_internal(char *target, const char *data,
                                             int len,
                                             const char *base64_encodes) {
  /* walk backwards, allowing fo inplace decoding (target == data) */
  int groups = len / 3;
  const int mod = len - (groups * 3);
  const int target_size = (groups + (mod != 0)) * 4;
  char *writer = target + target_size - 1;
  const char *reader = data + len - 1;
  writer[1] = 0;
  switch (mod) {
  case 2: {
    char tmp2 = *(reader--);
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = base64_encodes[((tmp2 & 15) << 2)];
    *(writer--) = base64_encodes[((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15)];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  case 1: {
    char tmp1 = *(reader--);
    *(writer--) = '=';
    *(writer--) = '=';
    *(writer--) = base64_encodes[(tmp1 & 3) << 4];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  } break;
  }
  while (groups) {
    groups--;
    const char tmp3 = *(reader--);
    const char tmp2 = *(reader--);
    const char tmp1 = *(reader--);
    *(writer--) = base64_encodes[tmp3 & 63];
    *(writer--) = base64_encodes[((tmp2 & 15) << 2) | ((tmp3 >> 6) & 3)];
    *(writer--) = base64_encodes[(((tmp1 & 3) << 4) | ((tmp2 >> 4) & 15))];
    *(writer--) = base64_encodes[(tmp1 >> 2) & 63];
  }
  return target_size;
}